

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_2_5::jacobiEigenSolver<double>
               (Matrix44<double> *A,Vec4<double> *S,Matrix44<double> *V,double tol)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  uint uVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_68 [5];
  undefined8 uStack_40;
  
  V->x[0][0] = 0.0;
  V->x[0][1] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 0.0;
  V->x[2][2] = 0.0;
  V->x[2][3] = 0.0;
  V->x[3][2] = 0.0;
  V->x[3][3] = 0.0;
  V->x[3][0] = 0.0;
  V->x[3][1] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[1][3] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][3] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  V->x[3][3] = 1.0;
  lVar9 = 0;
  pdVar11 = (double *)A;
  do {
    (&S->x)[lVar9] = *pdVar11;
    lVar9 = lVar9 + 1;
    pdVar11 = pdVar11 + 5;
  } while (lVar9 != 4);
  local_68[4] = 0.0;
  uVar10 = 0;
  pdVar11 = (double *)A;
  do {
    if (uVar10 < 3) {
      lVar9 = 1;
      do {
        dVar18 = ABS(pdVar11[lVar9]);
        if (ABS(pdVar11[lVar9]) <= local_68[4]) {
          dVar18 = local_68[4];
        }
        local_68[4] = dVar18;
        lVar1 = uVar10 + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar1 != 3);
    }
    uVar10 = uVar10 + 1;
    pdVar11 = pdVar11 + 5;
  } while (uVar10 != 4);
  local_68[4] = local_68[4] * tol;
  if ((local_68[4] != 0.0) || (NAN(local_68[4]))) {
    uStack_40 = 0;
    uVar12 = 0;
    do {
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      dVar18 = A->x[0][1];
      dVar15 = A->x[1][1] - A->x[0][0];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[0][1] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar14 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar15 = dVar14 * dVar14 + 1.0;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar16 = (1.0 / dVar15) * dVar14;
        dVar19 = dVar16 / (1.0 / dVar15 + 1.0);
        dVar18 = dVar18 * dVar14;
        local_68[0] = 0.0 - dVar18;
        local_68[1] = dVar18 + 0.0;
        A->x[0][0] = A->x[0][0] - dVar18;
        A->x[1][1] = dVar18 + A->x[1][1];
        A->x[0][1] = 0.0;
        dVar15 = A->x[0][2];
        dVar14 = A->x[0][3];
        dVar17 = A->x[1][2];
        dVar18 = A->x[1][3];
        A->x[0][2] = dVar15 - (dVar19 * dVar15 + dVar17) * dVar16;
        A->x[0][3] = dVar14 - (dVar19 * dVar14 + dVar18) * dVar16;
        dVar18 = (dVar14 - dVar19 * dVar18) * dVar16 + dVar18;
        auVar4._8_4_ = SUB84(dVar18,0);
        auVar4._0_8_ = (dVar15 - dVar19 * dVar17) * dVar16 + dVar17;
        auVar4._12_4_ = (int)((ulong)dVar18 >> 0x20);
        *(undefined1 (*) [16])(A->x[1] + 2) = auVar4;
        lVar9 = 0;
        do {
          dVar18 = *(double *)((long)V->x[0] + lVar9);
          dVar15 = *(double *)((long)V->x[1] + lVar9);
          dVar14 = *(double *)((long)V->x[0] + lVar9 + 8);
          dVar17 = *(double *)((long)V->x[1] + lVar9 + 8);
          dVar21 = (-dVar19 * dVar14 + dVar18) * dVar16 + dVar14;
          auVar5._8_4_ = SUB84(dVar21,0);
          auVar5._0_8_ = (dVar19 * dVar18 + dVar14) * -dVar16 + dVar18;
          auVar5._12_4_ = (int)((ulong)dVar21 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar9) = auVar5;
          pdVar11 = (double *)((long)V->x[1] + lVar9);
          *pdVar11 = (dVar19 * dVar15 + dVar17) * -dVar16 + dVar15;
          pdVar11[1] = (-dVar19 * dVar17 + dVar15) * dVar16 + dVar17;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      dVar18 = A->x[0][2];
      dVar15 = A->x[2][2] - A->x[0][0];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[0][2] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar15 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar17 = (1.0 / dVar14) * dVar15;
        dVar14 = dVar17 / (1.0 / dVar14 + 1.0);
        dVar18 = dVar18 * dVar15;
        local_68[0] = local_68[0] - dVar18;
        local_68[2] = dVar18 + 0.0;
        dVar15 = A->x[0][1];
        A->x[0][0] = A->x[0][0] - dVar18;
        A->x[2][2] = dVar18 + A->x[2][2];
        A->x[0][2] = 0.0;
        dVar18 = A->x[1][2];
        A->x[0][1] = dVar15 - (dVar14 * dVar15 + dVar18) * dVar17;
        A->x[1][2] = (dVar15 - dVar14 * dVar18) * dVar17 + dVar18;
        dVar18 = A->x[0][3];
        dVar15 = A->x[2][3];
        A->x[0][3] = dVar18 - (dVar14 * dVar18 + dVar15) * dVar17;
        A->x[2][3] = (dVar18 - dVar14 * dVar15) * dVar17 + dVar15;
        lVar9 = 0;
        do {
          dVar18 = *(double *)((long)V->x[0] + lVar9);
          dVar15 = *(double *)((long)V->x[0] + lVar9 + 0x10);
          dVar16 = *(double *)((long)V->x[1] + lVar9);
          dVar19 = *(double *)((long)V->x[1] + lVar9 + 0x10);
          *(double *)((long)V->x[0] + lVar9) = (dVar14 * dVar18 + dVar15) * -dVar17 + dVar18;
          *(double *)((long)V->x[1] + lVar9) = (dVar14 * dVar16 + dVar19) * -dVar17 + dVar16;
          *(double *)((long)V->x[0] + lVar9 + 0x10) = (-dVar14 * dVar15 + dVar18) * dVar17 + dVar15;
          *(double *)((long)V->x[1] + lVar9 + 0x10) = (-dVar14 * dVar19 + dVar16) * dVar17 + dVar19;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      dVar18 = A->x[0][3];
      dVar15 = A->x[3][3] - A->x[0][0];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[0][3] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar14 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar15 = dVar14 * dVar14 + 1.0;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar16 = (1.0 / dVar15) * dVar14;
        dVar18 = dVar18 * dVar14;
        local_68[0] = local_68[0] - dVar18;
        local_68[3] = dVar18 + 0.0;
        A->x[0][0] = A->x[0][0] - dVar18;
        dVar19 = dVar16 / (1.0 / dVar15 + 1.0);
        A->x[3][3] = dVar18 + A->x[3][3];
        A->x[0][3] = 0.0;
        dVar18 = A->x[1][3];
        dVar15 = A->x[2][3];
        dVar14 = A->x[0][1];
        dVar17 = A->x[0][2];
        A->x[1][3] = (dVar14 - dVar19 * dVar18) * dVar16 + dVar18;
        A->x[0][1] = dVar14 - (dVar19 * dVar14 + dVar18) * dVar16;
        A->x[0][2] = dVar17 - (dVar19 * dVar17 + dVar15) * dVar16;
        A->x[2][3] = (dVar17 - dVar19 * dVar15) * dVar16 + dVar15;
        lVar9 = 0;
        do {
          dVar18 = *(double *)((long)V->x[0] + lVar9);
          dVar15 = *(double *)((long)V->x[0] + lVar9 + 0x18);
          dVar14 = *(double *)((long)V->x[1] + lVar9);
          dVar17 = *(double *)((long)V->x[1] + lVar9 + 0x18);
          *(double *)((long)V->x[0] + lVar9) = (dVar19 * dVar18 + dVar15) * -dVar16 + dVar18;
          pdVar11 = (double *)((long)V->x[0] + lVar9 + 0x18);
          *pdVar11 = (-dVar19 * dVar15 + dVar18) * dVar16 + dVar15;
          pdVar11[1] = (dVar19 * dVar14 + dVar17) * -dVar16 + dVar14;
          *(double *)((long)V->x[1] + lVar9 + 0x18) = (-dVar19 * dVar17 + dVar14) * dVar16 + dVar17;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      dVar18 = A->x[1][2];
      dVar15 = A->x[2][2] - A->x[1][1];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar14 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar15 = dVar14 * dVar14 + 1.0;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar19 = (1.0 / dVar15) * dVar14;
        dVar21 = dVar19 / (1.0 / dVar15 + 1.0);
        dVar18 = dVar18 * dVar14;
        local_68[1] = local_68[1] - dVar18;
        local_68[2] = local_68[2] + dVar18;
        A->x[1][1] = A->x[1][1] - dVar18;
        A->x[2][2] = dVar18 + A->x[2][2];
        A->x[1][2] = 0.0;
        dVar17 = -dVar19;
        dVar14 = -dVar21;
        dVar15 = A->x[0][1];
        dVar16 = A->x[0][2];
        dVar18 = dVar19 * (dVar14 * dVar16 + dVar15) + dVar16;
        auVar6._8_4_ = SUB84(dVar18,0);
        auVar6._0_8_ = dVar17 * (dVar21 * dVar15 + dVar16) + dVar15;
        auVar6._12_4_ = (int)((ulong)dVar18 >> 0x20);
        *(undefined1 (*) [16])(A->x[0] + 1) = auVar6;
        dVar18 = A->x[1][3];
        dVar15 = A->x[2][3];
        A->x[1][3] = dVar18 - (dVar21 * dVar18 + dVar15) * dVar19;
        A->x[2][3] = (dVar18 - dVar21 * dVar15) * dVar19 + dVar15;
        lVar9 = 0;
        do {
          dVar18 = *(double *)((long)V->x[0] + lVar9 + 8);
          dVar15 = *(double *)((long)V->x[1] + lVar9 + 8);
          dVar16 = *(double *)((long)V->x[0] + lVar9 + 0x10);
          dVar20 = *(double *)((long)V->x[1] + lVar9 + 0x10);
          auVar2._8_4_ = SUB84(dVar21,0);
          auVar2._0_8_ = dVar14;
          auVar2._12_4_ = (int)((ulong)dVar14 >> 0x20);
          dVar22 = (dVar14 * dVar16 + dVar18) * dVar19 + dVar16;
          auVar7._8_4_ = SUB84(dVar22,0);
          auVar7._0_8_ = (dVar21 * dVar18 + dVar16) * dVar17 + dVar18;
          auVar7._12_4_ = (int)((ulong)dVar22 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar9 + 8) = auVar7;
          pdVar11 = (double *)((long)V->x[1] + lVar9 + 8);
          *pdVar11 = (dVar21 * dVar15 + dVar20) * dVar17 + dVar15;
          pdVar11[1] = (auVar2._8_8_ * dVar20 + dVar15) * dVar19 + dVar20;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      dVar18 = A->x[1][3];
      dVar15 = A->x[3][3] - A->x[1][1];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[1][3] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar15 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar17 = (1.0 / dVar14) * dVar15;
        dVar18 = dVar18 * dVar15;
        local_68[1] = local_68[1] - dVar18;
        local_68[3] = local_68[3] + dVar18;
        A->x[1][1] = A->x[1][1] - dVar18;
        dVar14 = dVar17 / (1.0 / dVar14 + 1.0);
        A->x[3][3] = dVar18 + A->x[3][3];
        A->x[1][3] = 0.0;
        dVar18 = A->x[0][1];
        dVar15 = A->x[0][3];
        A->x[0][1] = dVar18 - (dVar14 * dVar18 + dVar15) * dVar17;
        A->x[0][3] = (dVar18 - dVar14 * dVar15) * dVar17 + dVar15;
        dVar18 = A->x[1][2];
        dVar15 = A->x[2][3];
        A->x[1][2] = dVar18 - (dVar14 * dVar18 + dVar15) * dVar17;
        A->x[2][3] = (dVar18 - dVar14 * dVar15) * dVar17 + dVar15;
        lVar9 = 0;
        do {
          dVar18 = *(double *)((long)V->x[0] + lVar9 + 8);
          dVar15 = *(double *)((long)V->x[0] + lVar9 + 0x18);
          dVar16 = *(double *)((long)V->x[1] + lVar9 + 8);
          dVar19 = *(double *)((long)V->x[1] + lVar9 + 0x18);
          *(double *)((long)V->x[0] + lVar9 + 8) = (dVar14 * dVar18 + dVar15) * -dVar17 + dVar18;
          *(double *)((long)V->x[1] + lVar9 + 8) = (dVar14 * dVar16 + dVar19) * -dVar17 + dVar16;
          *(double *)((long)V->x[0] + lVar9 + 0x18) = (-dVar14 * dVar15 + dVar18) * dVar17 + dVar15;
          *(double *)((long)V->x[1] + lVar9 + 0x18) = (-dVar14 * dVar19 + dVar16) * dVar17 + dVar19;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      dVar18 = A->x[2][3];
      dVar15 = A->x[3][3] - A->x[2][2];
      if (ABS(dVar18 + dVar18) <= ABS(dVar15) * tol) {
        A->x[2][3] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar18 + dVar18);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar15 = *(double *)(&DAT_00110220 + (ulong)(dVar15 < 0.0) * 8) / (ABS(dVar15) + dVar14);
        dVar14 = dVar15 * dVar15 + 1.0;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar21 = (1.0 / dVar14) * dVar15;
        dVar18 = dVar18 * dVar15;
        local_68[2] = local_68[2] - dVar18;
        local_68[3] = local_68[3] + dVar18;
        A->x[2][2] = A->x[2][2] - dVar18;
        dVar20 = dVar21 / (1.0 / dVar14 + 1.0);
        A->x[3][3] = dVar18 + A->x[3][3];
        A->x[2][3] = 0.0;
        dVar15 = -dVar21;
        dVar18 = -dVar20;
        dVar14 = A->x[0][2];
        dVar17 = A->x[0][3];
        dVar16 = A->x[1][2];
        dVar19 = A->x[1][3];
        A->x[0][2] = (dVar20 * dVar14 + dVar17) * dVar15 + dVar14;
        A->x[0][3] = (dVar18 * dVar17 + dVar14) * dVar21 + dVar17;
        A->x[1][2] = (dVar20 * dVar16 + dVar19) * dVar15 + dVar16;
        A->x[1][3] = (dVar18 * dVar19 + dVar16) * dVar21 + dVar19;
        lVar9 = 0;
        do {
          dVar14 = *(double *)((long)V->x[0] + lVar9 + 0x10);
          dVar17 = *(double *)((long)V->x[1] + lVar9 + 0x10);
          dVar16 = *(double *)((long)V->x[0] + lVar9 + 0x18);
          dVar19 = *(double *)((long)V->x[1] + lVar9 + 0x18);
          auVar3._8_4_ = SUB84(dVar20,0);
          auVar3._0_8_ = dVar18;
          auVar3._12_4_ = (int)((ulong)dVar18 >> 0x20);
          dVar22 = (dVar18 * dVar16 + dVar14) * dVar21 + dVar16;
          auVar8._8_4_ = SUB84(dVar22,0);
          auVar8._0_8_ = (dVar20 * dVar14 + dVar16) * dVar15 + dVar14;
          auVar8._12_4_ = (int)((ulong)dVar22 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar9 + 0x10) = auVar8;
          pdVar11 = (double *)((long)V->x[1] + lVar9 + 0x10);
          *pdVar11 = (dVar20 * dVar17 + dVar19) * dVar15 + dVar17;
          pdVar11[1] = (auVar3._8_8_ * dVar19 + dVar17) * dVar21 + dVar19;
          lVar9 = lVar9 + 0x40;
        } while (lVar9 != 0x80);
      }
      lVar9 = 0;
      pdVar11 = (double *)A;
      do {
        dVar18 = local_68[lVar9] + (&S->x)[lVar9];
        (&S->x)[lVar9] = dVar18;
        *pdVar11 = dVar18;
        lVar9 = lVar9 + 1;
        pdVar11 = pdVar11 + 5;
      } while (lVar9 != 4);
      dVar18 = 0.0;
      uVar10 = 0;
      pdVar11 = (double *)A;
      do {
        if (uVar10 < 3) {
          lVar9 = 1;
          dVar15 = dVar18;
          do {
            dVar18 = ABS(pdVar11[lVar9]);
            if (ABS(pdVar11[lVar9]) <= dVar15) {
              dVar18 = dVar15;
            }
            lVar1 = uVar10 + lVar9;
            lVar9 = lVar9 + 1;
            dVar15 = dVar18;
          } while (lVar1 != 3);
        }
        uVar10 = uVar10 + 1;
        pdVar11 = pdVar11 + 5;
      } while (uVar10 != 4);
    } while ((local_68[4] < dVar18) && (bVar13 = uVar12 < 0x13, uVar12 = uVar12 + 1, bVar13));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A,
                   Vec4<T>& S,
                   Matrix44<T>& V,
                   const T tol)
{
    V.makeIdentity();

    for(int i = 0; i < 4; ++i) {
        S[i] = A[i][i];
    }

    const int maxIter = 20;  // In case we get really unlucky, prevents infinite loops
    const T absTol = tol * maxOffDiagSymm (A);  // Tolerance is in terms of the maximum
    if (absTol != 0)                        // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z(0, 0, 0, 0);
            bool changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for(int i = 0; i < 4; ++i) {
                A[i][i] = S[i] += Z[i];
            }
           if (!changed)
                break;
        } while (maxOffDiagSymm(A) > absTol && numIter < maxIter);
    }
}